

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::PythonGenerator::GenCompareOperator
          (PythonGenerator *this,StructDef *struct_def,string *code_ptr)

{
  pointer ppFVar1;
  string field_field;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  GenIndents_abi_cxx11_(&local_110,this,1);
  std::operator+(&field_field,&local_110,"def __eq__(self, other):");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&field_field);
  std::__cxx11::string::~string((string *)&local_110);
  GenIndents_abi_cxx11_(&local_110,this,2);
  std::operator+(&field_field,&local_110,"return type(self) == type(other)");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&field_field);
  std::__cxx11::string::~string((string *)&local_110);
  for (ppFVar1 = (struct_def->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar1 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppFVar1 = ppFVar1 + 1) {
    if ((*ppFVar1)->deprecated == false) {
      (*(this->namer_).super_Namer._vptr_Namer[0x12])(&field_field,&this->namer_);
      GenIndents_abi_cxx11_(&local_f0,this,3);
      std::operator+(&local_d0," and \\",&local_f0);
      std::operator+(&local_90,&local_d0,"self.");
      std::operator+(&local_70,&local_90,&field_field);
      std::operator+(&local_50,&local_70," == ");
      std::operator+(&local_b0,&local_50,"other.");
      std::operator+(&local_110,&local_b0,&field_field);
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&field_field);
    }
  }
  std::__cxx11::string::append((char *)code_ptr);
  return;
}

Assistant:

void GenCompareOperator(const StructDef &struct_def,
                          std::string *code_ptr) const {
    auto &code = *code_ptr;
    code += GenIndents(1) + "def __eq__(self, other):";
    code += GenIndents(2) + "return type(self) == type(other)";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;

      // Wrties the comparison statement for this field.
      const auto field_field = namer_.Field(field);
      code += " and \\" + GenIndents(3) + "self." + field_field +
              " == " + "other." + field_field;
    }
    code += "\n";
  }